

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O3

void * rw::gl3::copyNativeRaster(void *dst,void *param_2,int32 offset,int32 param_4)

{
  undefined8 *puVar1;
  long lVar2;
  
  lVar2 = (long)offset;
  *(undefined4 *)((long)dst + lVar2 + 0x10) = 0;
  *(undefined4 *)((long)dst + lVar2 + 0x20) = 0;
  puVar1 = (undefined8 *)((long)dst + lVar2 + 0x28);
  *puVar1 = 0;
  puVar1[1] = 0;
  return dst;
}

Assistant:

static void*
copyNativeRaster(void *dst, void *, int32 offset, int32)
{
	Gl3Raster *d = PLUGINOFFSET(Gl3Raster, dst, offset);
	d->texid = 0;
	d->fbo = 0;
	d->fboMate = nil;
	d->backingStore = nil;
	return dst;
}